

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManFlowFindBestCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,int Num)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *vCone_00;
  Vec_Ptr_t *vSet_00;
  Vec_Ptr_t *vUpper_00;
  int local_74;
  int local_70;
  int iVolBest;
  int iMinCut;
  int iBest;
  int VolCmp;
  int VolUpper;
  int VolLower;
  int Vol;
  int s;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSet;
  Vec_Ptr_t *vCone;
  Vec_Ptr_t *vMinCut;
  int nVolMin;
  int Num_local;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManNodeNum(p);
  iVar1 = (int)((long)((ulong)(uint)((int)((long)iVar1 / (long)Num) >> 0x1f) << 0x20 |
                      (long)iVar1 / (long)Num & 0xffffffffU) / 2);
  iVolBest = -1;
  local_70 = 1000000000;
  local_74 = 0;
  iVar2 = Llb_ManCutVolume(p,vLower,vUpper);
  if (iVar2 <= iVar1) {
    __assert_fail("Vol > nVolMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x48c,
                  "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)");
  }
  iVar1 = Abc_MinInt(iVar1,iVar2 - iVar1);
  vCone_00 = Vec_PtrAlloc(100);
  vSet_00 = Vec_PtrAlloc(100);
  Llb_ManFlowPrepareCut(p,vLower,vUpper);
  for (VolLower = 1; iVar2 = Aig_ManRegNum(p), VolLower < iVar2; VolLower = VolLower + 5) {
    for (Vol = 0; iVar2 = Vec_PtrSize(vLower), Vol < iVar2; Vol = Vol + 1) {
      Vec_PtrEntry(vLower,Vol);
      Llb_ManFlowGetObjSet(p,vLower,Vol,VolLower,vSet_00);
      Llb_ManFlowCollectAndMarkCone(p,vSet_00,vCone_00);
      iVar2 = Vec_PtrSize(vCone_00);
      if (iVar2 != 0) {
        vUpper_00 = Llb_ManFlowCompute(p);
        Llb_ManFlowUnmarkCone(p,vCone_00);
        iVar2 = Llb_ManCutVolume(p,vLower,vUpper_00);
        iVar3 = Llb_ManCutVolume(p,vUpper_00,vUpper);
        iVar2 = Abc_MinInt(iVar2,iVar3);
        if ((iVar1 <= iVar2) &&
           (((local_70 == -1 || (iVar3 = Vec_PtrSize(vUpper_00), iVar3 < local_70)) ||
            ((iVar3 = Vec_PtrSize(vUpper_00), local_70 == iVar3 && (local_74 < iVar2)))))) {
          iVolBest = Vol;
          local_70 = Vec_PtrSize(vUpper_00);
          local_74 = iVar2;
        }
        Vec_PtrFree(vUpper_00);
      }
    }
    if (-1 < iVolBest) break;
  }
  if (iVolBest == -1) {
    Vec_PtrFree(vCone_00);
    Vec_PtrFree(vSet_00);
    p_local = (Aig_Man_t *)0x0;
  }
  else {
    if (iVolBest < 0) {
      __assert_fail("iBest >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x4b4,
                    "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)")
      ;
    }
    Llb_ManFlowGetObjSet(p,vLower,iVolBest,VolLower,vSet_00);
    Llb_ManFlowCollectAndMarkCone(p,vSet_00,vCone_00);
    p_local = (Aig_Man_t *)Llb_ManFlowCompute(p);
    Llb_ManFlowUnmarkCone(p,vCone_00);
    Vec_PtrFree(vCone_00);
    Vec_PtrFree(vSet_00);
  }
  return (Vec_Ptr_t *)p_local;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowFindBestCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, int Num )
{
    int nVolMin = Aig_ManNodeNum(p) / Num / 2;
    Vec_Ptr_t * vMinCut;
    Vec_Ptr_t * vCone, * vSet;
    Aig_Obj_t * pObj;
    int i, s, Vol, VolLower, VolUpper, VolCmp;
    int iBest = -1, iMinCut = ABC_INFINITY, iVolBest = 0;

    Vol = Llb_ManCutVolume( p, vLower, vUpper );
    assert( Vol > nVolMin );
    VolCmp = Abc_MinInt( nVolMin, Vol - nVolMin );
    vCone = Vec_PtrAlloc( 100 );
    vSet  = Vec_PtrAlloc( 100 );
    Llb_ManFlowPrepareCut( p, vLower, vUpper );
    for ( s = 1; s < Aig_ManRegNum(p); s += 5 )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        {
            Llb_ManFlowGetObjSet( p, vLower, i, s, vSet );
            Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
            if ( Vec_PtrSize(vCone) == 0 )
                continue;
            vMinCut  = Llb_ManFlowCompute( p );
            Llb_ManFlowUnmarkCone( p, vCone );

            VolLower = Llb_ManCutVolume( p, vLower, vMinCut );
            VolUpper = Llb_ManCutVolume( p, vMinCut, vUpper );
            Vol = Abc_MinInt( VolLower, VolUpper );
            if ( Vol >= VolCmp &&  (iMinCut == -1 || 
                                    iMinCut >  Vec_PtrSize(vMinCut) || 
                                   (iMinCut == Vec_PtrSize(vMinCut) && iVolBest < Vol)) )
            {
                iBest = i;
                iMinCut = Vec_PtrSize(vMinCut);
                iVolBest = Vol;
            }
            Vec_PtrFree( vMinCut );
        }
        if ( iBest >= 0 )
            break;
    }
    if ( iBest == -1 )
    {
        // cleanup
        Vec_PtrFree( vCone );
        Vec_PtrFree( vSet );
        return NULL;
    }
    // get the best cut
    assert( iBest >= 0 );
    Llb_ManFlowGetObjSet( p, vLower, iBest, s, vSet );
    Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
    vMinCut = Llb_ManFlowCompute( p );
    Llb_ManFlowUnmarkCone( p, vCone );
    // cleanup
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSet );
    return vMinCut;
}